

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O1

ssize_t __thiscall
Imf_2_5::StdIFStream::read(StdIFStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ifstream *piVar1;
  bool bVar2;
  int *piVar3;
  undefined7 extraout_var;
  InputExc *this_00;
  undefined4 in_register_00000034;
  
  piVar1 = this->_is;
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    piVar3 = __errno_location();
    *piVar3 = 0;
    std::istream::read((char *)piVar1,CONCAT44(in_register_00000034,__fd));
    bVar2 = anon_unknown_0::checkError((istream *)this->_is,(long)(int)__buf);
    return CONCAT71(extraout_var,bVar2);
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_00,"Unexpected end of file.");
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

bool
StdIFStream::read (char c[/*n*/], int n)
{
    if (!*_is)
        throw IEX_NAMESPACE::InputExc ("Unexpected end of file.");

    clearError();
    _is->read (c, n);
    return checkError (*_is, n);
}